

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::dump(TypeBuilder *this)

{
  ulong uVar1;
  bool bVar2;
  __optional_ne_t<wasm::RecGroup,_wasm::RecGroup> _Var3;
  size_t sVar4;
  reference pHVar5;
  ostream *poVar6;
  RecGroup *pRVar7;
  Entry EVar8;
  Printed local_178;
  RecGroup local_150;
  RecGroup newGroup;
  HeapType type;
  iterator __end1;
  iterator __begin1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range1;
  optional<wasm::RecGroup> currGroup;
  string local_110;
  undefined1 local_f0 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  Entry local_48;
  value_type local_38;
  ulong local_30;
  size_t i;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  TypeBuilder *this_local;
  
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i);
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    sVar4 = size(this);
    if (sVar4 <= uVar1) break;
    EVar8 = operator[](this,local_30);
    local_48 = EVar8;
    local_38.id = (uintptr_t)Entry::operator_cast_to_HeapType(&local_48);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i,&local_38);
    local_30 = local_30 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"",
             (allocator<char> *)
             &currGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::RecGroup>.field_0xf);
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
  IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_f0,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &currGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::RecGroup>.field_0xf);
  std::optional<wasm::RecGroup>::optional((optional<wasm::RecGroup> *)&__range1);
  __end1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i);
  type.id = (uintptr_t)
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&type);
    if (!bVar2) break;
    pHVar5 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end1);
    newGroup.id = pHVar5->id;
    local_150 = HeapType::getRecGroup((HeapType *)&newGroup);
    _Var3 = std::operator!=(&local_150,(optional<wasm::RecGroup> *)&__range1);
    if (_Var3) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)&__range1);
      if (bVar2) {
        pRVar7 = std::optional<wasm::RecGroup>::operator->((optional<wasm::RecGroup> *)&__range1);
        sVar4 = RecGroup::size(pRVar7);
        if (1 < sVar4) {
          std::operator<<((ostream *)&std::cerr,")\n");
        }
      }
      sVar4 = RecGroup::size(&local_150);
      if (1 < sVar4) {
        std::operator<<((ostream *)&std::cerr,"(rec\n");
      }
      std::optional<wasm::RecGroup>::operator=((optional<wasm::RecGroup> *)&__range1,&local_150);
    }
    pRVar7 = std::optional<wasm::RecGroup>::operator->((optional<wasm::RecGroup> *)&__range1);
    sVar4 = RecGroup::size(pRVar7);
    if (1 < sVar4) {
      std::operator<<((ostream *)&std::cerr,"  ");
    }
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_178,
               (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_f0,(HeapType)newGroup.id);
    poVar6 = wasm::operator<<((ostream *)&std::cerr,&local_178);
    std::operator<<(poVar6,"\n");
    HeapType::Printed::~Printed(&local_178);
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end1);
  }
  bVar2 = std::optional::operator_cast_to_bool((optional *)&__range1);
  if (bVar2) {
    pRVar7 = std::optional<wasm::RecGroup>::operator->((optional<wasm::RecGroup> *)&__range1);
    sVar4 = RecGroup::size(pRVar7);
    if (1 < sVar4) {
      std::operator<<((ostream *)&std::cerr,")\n");
    }
  }
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
            ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_f0);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i);
  return;
}

Assistant:

void TypeBuilder::dump() {
  std::vector<HeapType> types;
  for (size_t i = 0; i < size(); ++i) {
    types.push_back((*this)[i]);
  }
  IndexedTypeNameGenerator<DefaultTypeNameGenerator> print(types);

  std::optional<RecGroup> currGroup;
  for (auto type : types) {
    if (auto newGroup = type.getRecGroup(); newGroup != currGroup) {
      if (currGroup && currGroup->size() > 1) {
        std::cerr << ")\n";
      }
      if (newGroup.size() > 1) {
        std::cerr << "(rec\n";
      }
      currGroup = newGroup;
    }
    if (currGroup->size() > 1) {
      std::cerr << "  ";
    }
    std::cerr << print(type) << "\n";
  }
  if (currGroup && currGroup->size() > 1) {
    std::cerr << ")\n";
  }
}